

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O2

bool operator<(AmsNetId *lhs,AmsNetId *rhs)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 6) goto LAB_00122396;
    uVar2 = uVar1 + 1;
  } while (lhs->b[uVar1] == rhs->b[uVar1]);
  uVar2 = (ulong)(lhs->b[uVar1] < rhs->b[uVar1]);
LAB_00122396:
  return (bool)(uVar1 < 6 & (byte)uVar2);
}

Assistant:

bool operator<(const AmsNetId& lhs, const AmsNetId& rhs)
{
    for (unsigned int i = 0; i < sizeof(rhs.b); ++i) {
        if (lhs.b[i] != rhs.b[i]) {
            return lhs.b[i] < rhs.b[i];
        }
    }
    return false;
}